

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rich_text.cpp
# Opt level: O2

void __thiscall
Am_Text_Viewing_Context_Data::Init
          (Am_Text_Viewing_Context_Data *this,Am_Rich_Text *inText,unsigned_long inWidth)

{
  SLIBlock *this_00;
  
  (this->super_Am_Wrapper).field_0xc = 0;
  Am_Rich_Text::operator=(&this->mText,inText);
  this->mCursorRef = -1;
  this->mWidth = inWidth;
  this->mNumLines = 0;
  this_00 = (SLIBlock *)operator_new(0x188);
  SLIBlock::SLIBlock(this_00);
  this->mFirstLIBlock = this_00;
  return;
}

Assistant:

void
Am_Text_Viewing_Context_Data::Init(Am_Rich_Text inText, unsigned long inWidth)
{
  mLIValid = false;
  mText = inText;
  mCursorRef = -1; // (inText == Am_No_Rich_Text)
  //  ? Am_No_Cursor : Am_No_Cursor; // inText->New_Cursor( this );
  mWidth = inWidth;
  mNumLines = 0;
  mFirstLIBlock = new SLIBlock;
}